

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  bool bVar2;
  allocator<char> local_d1;
  string local_d0;
  cmListFileParser local_b0;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  bVar2 = true;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,filename,&local_d1);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar2 == false) {
    local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (lfbt->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_b0.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
              .
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_b0.FileName = (char *)0x0;
    local_b0.ListFile = this;
    local_b0.Messenger = messenger;
    local_b0.Lexer = cmListFileLexer_New();
    local_b0.FunctionName._M_dataplus._M_p = (pointer)&local_b0.FunctionName.field_2;
    local_b0.FunctionName._M_string_length = 0;
    local_b0.FunctionName.field_2._M_local_buf[0] = '\0';
    local_b0.FunctionArguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.FunctionArguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.FunctionArguments.
    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = cmListFileParser::ParseFile(&local_b0,filename);
    cmListFileParser::~cmListFileParser(&local_b0);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger);
    parseError = !parser.ParseFile(filename);
  }

  return !parseError;
}